

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_selector_node.cpp
# Opt level: O3

void __thiscall
parallel_selector_node_false_true_Test::~parallel_selector_node_false_true_Test
          (parallel_selector_node_false_true_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(parallel_selector_node, false_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"parallel_selector_node\">"
      "<bhvr_tree class = \"false_node\"/>"
      "<bhvr_tree class = \"true_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_TRUE(result);
    EXPECT_EQ(1, agent->get_true_counter());
    EXPECT_EQ(1, agent->get_false_counter());
  });
}